

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,InsideExpression *expr)

{
  bool bVar1;
  InsideExpression *in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  Expression *range;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffff88;
  FlowAnalysisBase *in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_50;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_40;
  InsideExpression *local_10;
  
  local_10 = in_RSI;
  analysis::FlowAnalysisBase::tryEvalBool(in_stack_ffffffffffffff98,(Expression *)in_RDI);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x249981);
  ast::InsideExpression::left(local_10);
  visit<slang::ast::Expression>(in_RDI,in_stack_ffffffffffffff88);
  local_50 = ast::InsideExpression::rangeList(local_10);
  local_40 = &local_50;
  local_58._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff88);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(&local_58);
    visit<slang::ast::Expression>(in_RDI,in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void visitExpr(const InsideExpression& expr) {
        tryEvalBool(expr);
        visit(expr.left());
        for (auto range : expr.rangeList())
            visit(*range);
    }